

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::MeshLoader::loadSourceElement(MeshLoader *this,InputShared *input)

{
  Semantic SVar1;
  ulong uVar2;
  Semantic *pSVar3;
  ulong uVar4;
  bool bVar5;
  SourceBase *sourceBase;
  String *pSVar6;
  ostream *poVar7;
  ulong uVar8;
  MeshLoader *this_00;
  URI *copyFrom_;
  Semantic SStack_13c;
  String SStack_138;
  URI UStack_118;
  
  SVar1 = (input->super_InputUnshared).mSemantic;
  switch(SVar1) {
  case NORMAL:
    bVar5 = loadNormalsSourceElement(this,input);
    return bVar5;
  case OUTPUT:
  case OUT_TANGENT:
  case TANGENT:
    return false;
  case POSITION:
    bVar5 = loadPositionsSourceElement(this,input);
    return bVar5;
  case TEXBINORMAL:
    bVar5 = loadTexBinormalSourceElement(this,input);
    return bVar5;
  case TEXCOORD:
  case UV:
    bVar5 = loadTexCoordsSourceElement(this,input);
    return bVar5;
  case TEXTANGENT:
    bVar5 = loadTexTangentSourceElement(this,input);
    return bVar5;
  }
  if (SVar1 != COLOR) {
    return false;
  }
  SStack_13c = (input->super_InputUnshared).mSemantic;
  if (SStack_13c != COLOR) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The current input element is not a COLOR element!",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return false;
  }
  copyFrom_ = &(input->super_InputUnshared).mSource;
  COLLADABU::URI::URI(&UStack_118,copyFrom_,false);
  SStack_138._M_dataplus._M_p = (pointer)&SStack_138.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&SStack_138,UStack_118.mFragment._M_dataplus._M_p,
             UStack_118.mFragment._M_dataplus._M_p + UStack_118.mFragment._M_string_length);
  this_00 = this;
  sourceBase = SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&SStack_138);
  if (sourceBase != (SourceBase *)0x0) {
    uVar2 = (sourceBase->mLoadedInputElements).mCount;
    if (uVar2 == 0) {
LAB_008048be:
      if (sourceBase->mStride - 5 < 0xfffffffffffffffe) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"The color source ",0x11);
        pSVar6 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(pSVar6->_M_dataplus)._M_p,
                            pSVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," has a wrong dimension of ",0x1a)
        ;
        poVar7 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,". Dimensions between 3 (RGB) and 4 (RGBA) are allowed. ",0x37);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        bVar5 = false;
      }
      else {
        bVar5 = appendVertexValues(this_00,sourceBase,&this->mMesh->mColors);
      }
      SourceBase::addLoadedInputElement(sourceBase,&SStack_13c);
      goto LAB_0080498b;
    }
    pSVar3 = (sourceBase->mLoadedInputElements).mData;
    if (*pSVar3 != COLOR) {
      uVar4 = 1;
      do {
        uVar8 = uVar4;
        if (uVar2 == uVar8) break;
        uVar4 = uVar8 + 1;
      } while (pSVar3[uVar8] != COLOR);
      if (uVar2 <= uVar8) goto LAB_008048be;
    }
  }
  bVar5 = false;
LAB_0080498b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)SStack_138._M_dataplus._M_p != &SStack_138.field_2) {
    operator_delete(SStack_138._M_dataplus._M_p,SStack_138.field_2._M_allocated_capacity + 1);
  }
  COLLADABU::URI::~URI(&UStack_118);
  return bVar5;
}

Assistant:

bool MeshLoader::loadSourceElement ( const InputShared& input )
    {
        bool retValue = false;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        switch ( semantic )
        {
        case InputSemantic::POSITION:
            retValue = loadPositionsSourceElement ( input );
            break;
        case InputSemantic::NORMAL:
            retValue = loadNormalsSourceElement ( input );
            break;
        case InputSemantic::COLOR:
            retValue = loadColorsSourceElement ( input );
            break;
        case InputSemantic::UV:
        case InputSemantic::TEXCOORD:
            retValue = loadTexCoordsSourceElement ( input );
            break;
        case InputSemantic::TEXTANGENT:
            retValue = loadTexTangentSourceElement( input );
            break;
        case InputSemantic::TEXBINORMAL:
            retValue = loadTexBinormalSourceElement( input );
            break;
        default:
            // Not implemented source
//            std::cerr << "Source with semantic " << semantic << "not implemented!" << std::endl;
            retValue = false;
        }

        return retValue;
    }